

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_EmplaceSingle_Test::TestBody
          (ParallelFlatHashSet_EmplaceSingle_Test *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  size_t hashval;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  *this_00;
  iterator it;
  SharedLock m_1;
  Set m;
  DoNothing local_379;
  AssertHelper local_378;
  hasher local_370 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  key_arg<int> local_35c;
  iterator local_358;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  local_328;
  
  local_358.inner_ = (Inner *)&DAT_b00000001;
  iVar7 = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::parallel_hash_set<int_const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_328,(int *)&local_358,(int *)&local_358.inner_end_,0,local_370,
             (key_equal *)&local_378,(allocator_type *)&local_35c);
  local_358.inner_ = (Inner *)((ulong)local_358.inner_ & 0xffffffff00000000);
  do {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)iVar7;
    hashval = SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
              SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0);
    uVar4 = (ulong)((((uint)(hashval >> 0x18) & 0xff ^
                     (uint)(hashval >> 0x10) & 0xffff ^ (uint)(hashval >> 8) & 0xffffff) & 0xf) *
                   0x30);
    this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
               *)((long)&local_328.sets_._M_elems[0].set_.ctrl_ + uVar4);
    sVar5 = raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
            ::_find_key<int>(this_00,(int *)&local_358,hashval);
    if (sVar5 == 0xffffffffffffffff) {
      sVar5 = raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
              ::prepare_insert(this_00,hashval);
      lVar1 = *(long *)((long)&local_328.sets_._M_elems[0].set_.slots_ + uVar4);
      if (lVar1 == 0) {
        __assert_fail("*slot_",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x5ee,
                      "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<int>>::constructor::operator()(Args &&...) const [Policy = phmap::priv::FlatHashSetPolicy<int>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<int>, Args = <const int &>]"
                     );
      }
      *(int *)(lVar1 + sVar5 * 4) = iVar7;
      raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
      ::set_ctrl(this_00,sVar5,(byte)hashval & 0x7f);
    }
    else {
      it.ctrl_ = this_00->ctrl_ + sVar5;
      it.field_1.slot_ =
           (slot_type *)
           (sVar5 * 4 + *(long *)((long)&local_328.sets_._M_elems[0].set_.slots_ + uVar4));
      raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
      ::_erase(this_00,it);
    }
    iVar3 = (int)local_358.inner_;
    iVar7 = (int)local_358.inner_ + 1;
    local_358.inner_ = (Inner *)CONCAT44(local_358.inner_._4_4_,iVar7);
  } while (iVar3 < 0xb);
  local_35c = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::find<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
            (&local_358,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_328,&local_35c,0,&local_379);
  local_378.data_ = (AssertHelperData *)(ulong)(local_358.inner_ != (Inner *)0x0);
  local_358.inner_ = (Inner *)CONCAT44(local_358.inner_._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_370,"m.count(0)","1",(unsigned_long *)&local_378,(int *)&local_358);
  if (local_370[0] == (hasher)0x0) {
    testing::Message::Message((Message *)&local_358);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x80,pcVar6);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_358.inner_ != (Inner *)0x0) {
      (**(code **)(((local_358.inner_)->set_).ctrl_ + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_368,local_368);
  }
  local_35c = 1;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::find<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
            (&local_358,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_328,&local_35c,0xde5fb9d2630458e9,&local_379);
  local_378.data_ = (AssertHelperData *)(ulong)(local_358.inner_ != (Inner *)0x0);
  local_358.inner_ = (Inner *)((ulong)local_358.inner_ & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_370,"m.count(1)","0",(unsigned_long *)&local_378,(int *)&local_358);
  if (local_370[0] == (hasher)0x0) {
    testing::Message::Message((Message *)&local_358);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x81,pcVar6);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_358.inner_ != (Inner *)0x0) {
      (**(code **)(((local_358.inner_)->set_).ctrl_ + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_368,local_368);
  }
  local_35c = 2;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::find<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
            (&local_358,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_328,&local_35c,0xbcbf73a4c608b1d3,&local_379);
  local_378.data_ = (AssertHelperData *)(ulong)(local_358.inner_ != (Inner *)0x0);
  local_358.inner_ = (Inner *)CONCAT44(local_358.inner_._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_370,"m.count(2)","1",(unsigned_long *)&local_378,(int *)&local_358);
  if (local_370[0] == (hasher)0x0) {
    testing::Message::Message((Message *)&local_358);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x82,pcVar6);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_358.inner_ != (Inner *)0x0) {
      (**(code **)(((local_358.inner_)->set_).ctrl_ + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_368,local_368);
  }
  local_35c = 0xb;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::find<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
            (&local_358,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_328,&local_35c,0x8e1cfc0a412fd20c,&local_379);
  local_378.data_ = (AssertHelperData *)(ulong)(local_358.inner_ != (Inner *)0x0);
  local_358.inner_ = (Inner *)((ulong)local_358.inner_ & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_370,"m.count(11)","0",(unsigned_long *)&local_378,(int *)&local_358);
  if (local_370[0] == (hasher)0x0) {
    testing::Message::Message((Message *)&local_358);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/parallel_hash_set_test.cc"
               ,0x83,pcVar6);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_358.inner_ != (Inner *)0x0) {
      (**(code **)(((local_358.inner_)->set_).ctrl_ + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_368,local_368);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::~parallel_hash_set(&local_328);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, EmplaceSingle) {
    using Set = phmap::THIS_HASH_SET<int>;

    // --------------------
    // test emplace_single
    // --------------------
    Set m = { 1, 11 };
 
    // emplace_single insert a value if not already present, else removes it
    for (int i=0; i<12; ++i)
        m.emplace_single(i, [i](const Set::constructor& ctor) { ctor(i); });
    EXPECT_EQ(m.count(0), 1);
    EXPECT_EQ(m.count(1), 0);
    EXPECT_EQ(m.count(2), 1);
    EXPECT_EQ(m.count(11), 0);
}